

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall L14_3::Singer::set_data(Singer *this)

{
  int *piVar1;
  uint uVar2;
  char *__s;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter number for singer\'s vocal range:\n",0x27);
  puVar7 = &pv;
  lVar8 = 0;
  do {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(uint)lVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    __s = (char *)*puVar7;
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((~(uint)lVar8 & 3) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    lVar8 = lVar8 + 1;
    puVar7 = puVar7 + 1;
  } while (lVar8 != 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  piVar1 = &this->_voice;
  plVar6 = (long *)std::istream::operator>>((istream *)&std::cin,piVar1);
  if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
    uVar2 = this->_voice;
    while (4 < uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please enter a value in range [0, ",0x22);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
      plVar6 = (long *)std::istream::operator>>((istream *)&std::cin,piVar1);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
      uVar2 = *piVar1;
    }
  }
  do {
    iVar3 = std::istream::get();
  } while (iVar3 != 10);
  return;
}

Assistant:

void Singer::set_data() {
        std::cout << "Enter number for singer's vocal range:\n";
        //  output available vocals
        int i;
        for (i = 0; i < VoiceType; i++) {
            std::cout << i << ": " << pv[i] << " ";
            if (i % 4 == 3) {
                std::cout << std::endl;
            }
        }
        if (i % 4 != 0) {
            std::cout << std::endl;
        }
        //  只能输入 [0~VoiceType)范围内的数值
        while(std::cin >> _voice && (_voice < 0 || _voice >= VoiceType)) {
            std::cout << "Please enter a value in range [0, " << VoiceType << ");\n";
        }
        while(std::cin.get() != '\n') {
            continue;
        }
    }